

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_rectfill_rgba(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  quint32 height_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  uint in_R8D;
  QRgba64 *in_R9;
  int iVar1;
  int iVar2;
  
  QRasterBuffer::buffer(in_RDI);
  QRgba64::toArgb32(in_R9);
  height_00 = ARGB2RGBA(0);
  iVar1 = in_EDX;
  iVar2 = in_ESI;
  QRasterBuffer::bytesPerLine(in_RDI);
  qt_rectfill<unsigned_int>
            ((uint *)in_R9,in_R8D,in_ECX,in_EDX,in_ESI,height_00,CONCAT44(iVar2,iVar1));
  return;
}

Assistant:

static void qt_rectfill_rgba(QRasterBuffer *rasterBuffer,
                             int x, int y, int width, int height,
                             const QRgba64 &color)
{
    qt_rectfill<quint32>(reinterpret_cast<quint32 *>(rasterBuffer->buffer()),
                         ARGB2RGBA(color.toArgb32()), x, y, width, height, rasterBuffer->bytesPerLine());
}